

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

void __thiscall Company::Company(Company *this,int bu,Boss *b,Employee **emp)

{
  undefined1 auVar1 [16];
  int iVar2;
  Boss *this_00;
  ulong uVar3;
  Employee **ppEVar4;
  Employee *this_01;
  int local_38;
  int i;
  Employee **emp_local;
  Boss *b_local;
  int bu_local;
  Company *this_local;
  
  this->budget = bu;
  this_00 = (Boss *)operator_new(0xc0);
  Boss::Boss(this_00,b);
  this->boss = this_00;
  iVar2 = Boss::getNumberOfEmployees(this->boss);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppEVar4 = (Employee **)operator_new__(uVar3);
  this->employees = ppEVar4;
  local_38 = 0;
  while( true ) {
    iVar2 = Boss::getNumberOfEmployees(this->boss);
    if (iVar2 <= local_38) break;
    this_01 = (Employee *)operator_new(0xb8);
    Employee::Employee(this_01,emp[local_38]);
    this->employees[local_38] = this_01;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

Company::Company(int bu, const Boss &b, Employee **emp) : budget(bu) {
    boss = new Boss(b);
    employees = new Employee *[boss->getNumberOfEmployees()];
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        employees[i] = new Employee(*emp[i]);
    }
}